

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

Index __thiscall Scope::GetPositionForIndex(Scope *this,Index i)

{
  bool bVar1;
  reference puVar2;
  ostream *this_00;
  E *this_01;
  stringstream *arg;
  uint in_ESI;
  stringstream ss;
  Index pos;
  const_iterator it;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe18;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_fffffffffffffe20;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_fffffffffffffe28;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  uint *local_30;
  uint *local_28;
  Index local_1c;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_18;
  uint local_c;
  
  local_c = in_ESI;
  local_18._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (in_stack_fffffffffffffe18);
  local_1c = 0;
  do {
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_18);
    if (*puVar2 == local_c) {
      return local_1c;
    }
    local_1c = local_1c + 1;
    local_28 = (uint *)__gnu_cxx::
                       __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       ::operator++(in_stack_fffffffffffffe28,
                                    (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
    local_30 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 (in_stack_fffffffffffffe18);
    bVar1 = __gnu_cxx::operator==
                      (in_stack_fffffffffffffe20,
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_fffffffffffffe18);
  } while (!bVar1);
  std::__cxx11::stringstream::stringstream(local_1b8);
  this_00 = std::operator<<(local_1a8,"Scope::GetPositionForIndex(Index i=");
  this_01 = (E *)std::ostream::operator<<(this_00,local_c);
  std::operator<<((ostream *)this_01,") not found!");
  arg = (stringstream *)__cxa_allocate_exception(0x28);
  E::E(this_01,arg);
  __cxa_throw(arg,&E::typeinfo,E::~E);
}

Assistant:

Index Scope::GetPositionForIndex(Index i) const
{
    SDT::const_iterator it = this->begin();
    Index pos = 0;
    while( *it != i )
    {
        pos++;
        it++;
        if(it == this->end())
        {
            stringstream ss;
            ss << "Scope::GetPositionForIndex(Index i=" << i <<") not found!";
            throw E(ss);
        }

    }
    // *it == i, so...
    return(pos);
}